

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O1

ssize_t __thiscall
wasm::LEB<unsigned_long,_unsigned_char>::read
          (LEB<unsigned_long,_unsigned_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  string *psVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  uVar3 = CONCAT44(in_register_00000034,__fd);
  this->value = 0;
  uVar6 = 0;
  uVar4 = uVar3;
  while( true ) {
    if (*(long *)(uVar3 + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (**(code **)(uVar3 + 0x18))(uVar3,uVar4,__buf,__nbytes);
    __buf = (void *)(ulong)(bVar1 & 0x7f);
    pvVar5 = (void *)(-(ulong)(uVar6 == 0) | ~(-1L << (-(char)uVar6 & 0x3fU)));
    __nbytes = uVar6 & 0xffffffff;
    uVar4 = (ulong)((uint)(bVar1 & 0x7f) & (uint)pvVar5) << ((byte)__nbytes & 0x3f);
    this->value = this->value | uVar4;
    if (pvVar5 < __buf) break;
    if (((char)bVar1 < '\0') && (uVar6 = uVar6 + 7, 0x3f < uVar6)) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"LEB overflow","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_48,local_48 + local_40);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if (-1 < (char)bVar1) {
      return (ssize_t)this;
    }
  }
  psVar2 = (string *)__cxa_allocate_exception(0x30);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Unused non-negative LEB bits must be 0s","");
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar2,local_68,local_68 + local_60);
  *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
  *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
  *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
  *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
  __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }